

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# runtime.hpp
# Opt level: O3

var * __thiscall
cs::domain_manager::get_var_global<cs::var_id_const&>(domain_manager *this,var_id *name)

{
  domain_type *this_00;
  var *pvVar1;
  error *this_01;
  string local_30;
  
  this_00 = (this->m_data).m_start;
  if ((this->m_data).m_current != this_00) {
    pvVar1 = domain_type::get_var(this_00,name);
    return pvVar1;
  }
  this_01 = (error *)__cxa_allocate_exception(0x28);
  local_30._M_dataplus._M_p = (pointer)&local_30.field_2;
  local_30.field_2._M_allocated_capacity._0_4_ = 0x30303045;
  local_30.field_2._M_allocated_capacity._4_2_ = 0x48;
  local_30._M_string_length = 5;
  cov::error::error(this_01,&local_30);
  __cxa_throw(this_01,&cov::error::typeinfo,cov::error::~error);
}

Assistant:

var &get_var_global(T &&name)
		{
			return m_data.bottom().get_var(name);
		}